

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

tag_type __thiscall
cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::valid_tag
          (rules_holder<cppcms::xss::icompare_c_string,_false> *this,c_string *t)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator p;
  map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [3];
  tag_type local_4;
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x4650b6);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==(local_20,&local_28);
  if (bVar1) {
    local_4 = invalid_tag;
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>
                           *)0x4650f7);
    local_4 = (ppVar2->second).type;
  }
  return local_4;
}

Assistant:

rules::tag_type valid_tag(c_string const &t) const
		{
			typename tags_type::const_iterator p = tags.find(t);
			if(p==tags.end())
				return rules::invalid_tag;
			return p->second.type;
		}